

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_CreateRange(Cba_Ntk_t *p,int iFon,int NameId)

{
  int x;
  int f;
  int RangeId;
  int NameId_local;
  int iFon_local;
  Cba_Ntk_t *p_local;
  
  f = Cba_NtkGetMap(p,NameId);
  x = -f;
  if (x < 0) {
    p_local._4_4_ = Cba_FonRangeSize(p,f);
  }
  else {
    Cba_NtkUnsetMap(p,NameId);
    Cba_NtkSetMap(p,NameId,iFon);
    if (x == 0) {
      p_local._4_4_ = 1;
    }
    else {
      if (x < 1) {
        __assert_fail("RangeId > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x5dc,"int Prs_CreateRange(Cba_Ntk_t *, int, int)");
      }
      Cba_FonSetRangeSign(p,iFon,x);
      p_local._4_4_ = Cba_FonRangeSize(p,iFon);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Prs_CreateRange( Cba_Ntk_t * p, int iFon, int NameId )
{
    int RangeId = -Cba_NtkGetMap(p, NameId);
    if ( RangeId < 0 ) // this variable is already created
        return Cba_FonRangeSize( p, -RangeId );
    Cba_NtkUnsetMap( p, NameId );
    Cba_NtkSetMap( p, NameId, iFon );
    if ( RangeId == 0 )
        return 1;
    assert( RangeId > 0 );
    Cba_FonSetRangeSign( p, iFon, RangeId );
    return Cba_FonRangeSize( p, iFon );
}